

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O1

int lua_resetthread(lua_State *L)

{
  StkId level;
  int *piVar1;
  int iVar2;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                  ,0x148,"int lua_resetthread(lua_State *)");
  }
  L->ci = &L->base_ci;
  level = L->stack;
  level->tt_ = 0;
  (L->base_ci).func = level;
  (L->base_ci).callstatus = 0;
  iVar2 = luaF_close(L,level,-2);
  if (iVar2 == -2) {
    L->top = L->stack + 1;
    iVar2 = 0;
  }
  else {
    luaD_seterrorobj(L,iVar2,L->stack + 1);
  }
  (L->base_ci).top = L->top + 0x14;
  L->status = (lu_byte)iVar2;
  piVar1 = *(int **)&L[-1].hookmask;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    return iVar2;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                ,0x156,"int lua_resetthread(lua_State *)");
}

Assistant:

int lua_resetthread (lua_State *L) {
  CallInfo *ci;
  int status;
  lua_lock(L);
  L->ci = ci = &L->base_ci;  /* unwind CallInfo list */
  setnilvalue(L->stack);  /* 'function' entry for basic 'ci' */
  ci->func = L->stack;
  ci->callstatus = 0;
  status = luaF_close(L, L->stack, CLOSEPROTECT);
  if (status != CLOSEPROTECT)  /* real errors? */
    luaD_seterrorobj(L, status, L->stack + 1);
  else {
    status = LUA_OK;
    L->top = L->stack + 1;
  }
  ci->top = L->top + LUA_MINSTACK;
  L->status = status;
  lua_unlock(L);
  return status;
}